

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

void __thiscall BMP::~BMP(BMP *this)

{
  GreyCount *pGVar1;
  GreyCount *this_00;
  int local_14;
  int i;
  BMP *this_local;
  
  pGVar1 = this->alphabet->symbol;
  if (pGVar1 != (GreyCount *)0x0) {
    this_00 = pGVar1 + *(long *)&pGVar1[-1].field_0x78;
    while (pGVar1 != this_00) {
      this_00 = this_00 + -1;
      bitMap::GreyCount::~GreyCount(this_00);
    }
    operator_delete__(&pGVar1[-1].field_0x70);
  }
  if (this->alphabet != (Alphabet *)0x0) {
    operator_delete__(this->alphabet);
  }
  for (local_14 = 0; local_14 < (this->headInfo).biWidth; local_14 = local_14 + 1) {
    if (this->field[local_14] != (uchar *)0x0) {
      operator_delete__(this->field[local_14]);
    }
  }
  if (this->field != (uchar **)0x0) {
    operator_delete__(this->field);
  }
  return;
}

Assistant:

BMP::~BMP()
{
    using namespace bitMap;

    delete[] alphabet->symbol;
    delete[] alphabet;

    for ( int i = 0; i < headInfo.biWidth; i++ ){
        delete[] field[ i ];
    }
    delete[] field;
}